

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3ExprAnd(Parse *pParse,Expr *pLeft,Expr *pRight)

{
  uint op;
  Parse *in_RDX;
  Parse *in_RSI;
  undefined8 *in_RDI;
  u32 f;
  sqlite3 *db;
  Expr *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  sqlite3 *db_00;
  Parse *local_8;
  
  db_00 = (sqlite3 *)*in_RDI;
  local_8 = in_RDX;
  if ((in_RSI != (Parse *)0x0) && (local_8 = in_RSI, in_RDX != (Parse *)0x0)) {
    op = *(u32 *)((long)&in_RSI->db + 4) | *(uint *)((long)&in_RDX->db + 4);
    if (((op & 0x20000003) == 0x20000000) && (*(byte *)((long)in_RDI + 0x134) < 2)) {
      sqlite3ExprDeferredDelete
                ((Parse *)CONCAT44(op,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
      sqlite3ExprDeferredDelete
                ((Parse *)CONCAT44(op,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
      local_8 = (Parse *)sqlite3Expr(db_00,op,(char *)in_stack_ffffffffffffffc8);
    }
    else {
      local_8 = (Parse *)sqlite3PExpr(in_RDX,(int)((ulong)db_00 >> 0x20),
                                      (Expr *)CONCAT44(op,in_stack_ffffffffffffffd0),
                                      in_stack_ffffffffffffffc8);
    }
  }
  return (Expr *)local_8;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAnd(Parse *pParse, Expr *pLeft, Expr *pRight){
  sqlite3 *db = pParse->db;
  if( pLeft==0  ){
    return pRight;
  }else if( pRight==0 ){
    return pLeft;
  }else{
    u32 f = pLeft->flags | pRight->flags;
    if( (f&(EP_OuterON|EP_InnerON|EP_IsFalse))==EP_IsFalse
     && !IN_RENAME_OBJECT
    ){
      sqlite3ExprDeferredDelete(pParse, pLeft);
      sqlite3ExprDeferredDelete(pParse, pRight);
      return sqlite3Expr(db, TK_INTEGER, "0");
    }else{
      return sqlite3PExpr(pParse, TK_AND, pLeft, pRight);
    }
  }
}